

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Parens * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Parens,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_3)

{
  Parens *__x;
  Parens *in_RCX;
  LocationRange *in_R8;
  Parens *r;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
  *in_stack_ffffffffffffffc0;
  AST *in_stack_ffffffffffffffc8;
  Fodder *in_stack_ffffffffffffffd0;
  
  __x = (Parens *)operator_new(0xa0);
  Parens::Parens(in_RCX,in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (Fodder *)in_stack_ffffffffffffffc0);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)__x);
  return __x;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }